

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_trd.cpp
# Opt level: O0

int ReturnWithError(char *errorText,path *fname,FILE *fileToClose)

{
  path *message;
  char *badValueMessage;
  string local_40;
  FILE *local_20;
  FILE *fileToClose_local;
  path *fname_local;
  char *errorText_local;
  
  local_20 = fileToClose;
  fileToClose_local = (FILE *)fname;
  fname_local = (path *)errorText;
  if (fileToClose != (FILE *)0x0) {
    fclose((FILE *)fileToClose);
  }
  message = fname_local;
  std::filesystem::__cxx11::path::string(&local_40,(path *)fileToClose_local);
  badValueMessage = (char *)std::__cxx11::string::c_str();
  Error((char *)message,badValueMessage,IF_FIRST);
  std::__cxx11::string::~string((string *)&local_40);
  return 0;
}

Assistant:

static int ReturnWithError(const char* errorText, const std::filesystem::path & fname, FILE* fileToClose) {
	if (nullptr != fileToClose) fclose(fileToClose);
	Error(errorText, fname.string().c_str(), IF_FIRST);
	return 0;
}